

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableModel.cpp
# Opt level: O2

QVariant * __thiscall
TableModel::headerData
          (QVariant *__return_storage_ptr__,TableModel *this,int section,Orientation orientation,
          int role)

{
  long i;
  const_reference pQVar1;
  QVariant local_30;
  
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  if (((role & 0xfffffffdU) == 0) && (this->m_supplyHeaderData == true)) {
    i = (long)section;
    if (orientation == Horizontal) {
      if ((this->m_horizontalHeaderData).d.size <= i) {
        return __return_storage_ptr__;
      }
      pQVar1 = QList<QString>::at(&this->m_horizontalHeaderData,i);
      QVariant::QVariant(&local_30,(QString *)pQVar1);
    }
    else {
      if ((this->m_verticalHeaderData).d.size <= i) {
        return __return_storage_ptr__;
      }
      pQVar1 = QList<QString>::at(&this->m_verticalHeaderData,i);
      QVariant::QVariant(&local_30,(QString *)pQVar1);
    }
    QVariant::operator=(__return_storage_ptr__,&local_30);
    QVariant::~QVariant(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant TableModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    QVariant result;

    switch (role) {
    case Qt::DisplayRole:
    case Qt::EditRole:
        if (m_supplyHeaderData) {
            if (orientation == Qt::Horizontal) { // column header data:
                if (section < m_horizontalHeaderData.count())
                    result = m_horizontalHeaderData[section];
            } else {
                // row header data:
                if (section < m_verticalHeaderData.count())
                    result = m_verticalHeaderData[section];
            }
        }
        break;
    // case Qt::TextAlignmentRole:
    //         result = QVariant ( Qt::AlignHCenter | Qt::AlignHCenter );
    // break;
    default:
        break;
    }
    return result;
}